

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpp_buffer_impl.cpp
# Opt level: O0

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer,char *caller)

{
  MPP_RET MVar1;
  MPP_RET ret;
  char *caller_local;
  MppBufferImpl *buffer_local;
  
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","enter\n","mpp_buffer_ref_inc");
  }
  MVar1 = inc_buffer_ref(buffer,caller);
  if ((mpp_buffer_debug & 1) != 0) {
    _mpp_log_l(4,"mpp_buffer","leave\n","mpp_buffer_ref_inc");
  }
  return MVar1;
}

Assistant:

MPP_RET mpp_buffer_ref_inc(MppBufferImpl *buffer, const char* caller)
{
    MPP_BUF_FUNCTION_ENTER();

    MPP_RET ret = inc_buffer_ref(buffer, caller);

    MPP_BUF_FUNCTION_LEAVE();
    return ret;
}